

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walkWindowList(Walker *pWalker,Window *pList)

{
  int iVar1;
  Window *local_28;
  Window *pWin;
  Window *pList_local;
  Walker *pWalker_local;
  
  local_28 = pList;
  while( true ) {
    if (local_28 == (Window *)0x0) {
      return 0;
    }
    iVar1 = sqlite3WalkExprList(pWalker,local_28->pOrderBy);
    if (iVar1 != 0) {
      return 2;
    }
    iVar1 = sqlite3WalkExprList(pWalker,local_28->pPartition);
    if (iVar1 != 0) {
      return 2;
    }
    iVar1 = sqlite3WalkExpr(pWalker,local_28->pFilter);
    if (iVar1 != 0) break;
    local_28 = local_28->pNextWin;
  }
  return 2;
}

Assistant:

static int walkWindowList(Walker *pWalker, Window *pList){
  Window *pWin;
  for(pWin=pList; pWin; pWin=pWin->pNextWin){
    if( sqlite3WalkExprList(pWalker, pWin->pOrderBy) ) return WRC_Abort;
    if( sqlite3WalkExprList(pWalker, pWin->pPartition) ) return WRC_Abort;
    if( sqlite3WalkExpr(pWalker, pWin->pFilter) ) return WRC_Abort;
  }
  return WRC_Continue;
}